

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O0

void __thiscall jpge::jpeg_encoder::load_mcu(jpeg_encoder *this,void *pSrc)

{
  uint8 uVar1;
  uint8 uVar2;
  uint8 uVar3;
  byte bVar4;
  uint8 *puVar5;
  int local_3c;
  uint8 *puStack_38;
  int i;
  uint8 *q;
  uint8 cr;
  uint8 cb;
  uint8 y;
  uint8 *pDst;
  uint8 *Psrc;
  void *pSrc_local;
  jpeg_encoder *this_local;
  
  puVar5 = this->m_mcu_lines[this->m_mcu_y_ofs];
  if (this->m_num_components == '\x01') {
    if (this->m_image_bpp == 4) {
      RGBA_to_Y(puVar5,(uint8 *)pSrc,this->m_image_x);
    }
    else if (this->m_image_bpp == 3) {
      RGB_to_Y(puVar5,(uint8 *)pSrc,this->m_image_x);
    }
    else {
      memcpy(puVar5,pSrc,(long)this->m_image_x);
    }
  }
  else if (this->m_image_bpp == 4) {
    RGBA_to_YCC(puVar5,(uint8 *)pSrc,this->m_image_x);
  }
  else if (this->m_image_bpp == 3) {
    RGB_to_YCC(puVar5,(uint8 *)pSrc,this->m_image_x);
  }
  else {
    Y_to_YCC(puVar5,(uint8 *)pSrc,this->m_image_x);
  }
  if (this->m_num_components == '\x01') {
    memset(this->m_mcu_lines[this->m_mcu_y_ofs] + this->m_image_bpl_xlt,
           (uint)puVar5[this->m_image_bpl_xlt + -1],(long)(this->m_image_x_mcu - this->m_image_x));
  }
  else {
    uVar1 = puVar5[this->m_image_bpl_xlt + -3];
    uVar2 = puVar5[this->m_image_bpl_xlt + -2];
    uVar3 = puVar5[this->m_image_bpl_xlt + -1];
    puStack_38 = this->m_mcu_lines[this->m_mcu_y_ofs] + this->m_image_bpl_xlt;
    for (local_3c = this->m_image_x; local_3c < this->m_image_x_mcu; local_3c = local_3c + 1) {
      *puStack_38 = uVar1;
      puVar5 = puStack_38 + 2;
      puStack_38[1] = uVar2;
      puStack_38 = puStack_38 + 3;
      *puVar5 = uVar3;
    }
  }
  bVar4 = this->m_mcu_y_ofs + 1;
  this->m_mcu_y_ofs = bVar4;
  if ((uint)bVar4 == this->m_mcu_y) {
    process_mcu_row(this);
    this->m_mcu_y_ofs = '\0';
  }
  return;
}

Assistant:

void jpeg_encoder::load_mcu(const void *pSrc)
{
  const uint8* Psrc = reinterpret_cast<const uint8*>(pSrc);

  uint8* pDst = m_mcu_lines[m_mcu_y_ofs]; // OK to write up to m_image_bpl_xlt bytes to pDst

  if (m_num_components == 1)
  {
    if (m_image_bpp == 4)
      RGBA_to_Y(pDst, Psrc, m_image_x);
    else if (m_image_bpp == 3)
      RGB_to_Y(pDst, Psrc, m_image_x);
    else
      memcpy(pDst, Psrc, m_image_x);
  }
  else
  {
    if (m_image_bpp == 4)
      RGBA_to_YCC(pDst, Psrc, m_image_x);
    else if (m_image_bpp == 3)
      RGB_to_YCC(pDst, Psrc, m_image_x);
    else
      Y_to_YCC(pDst, Psrc, m_image_x);
  }

  // Possibly duplicate pixels at end of scanline if not a multiple of 8 or 16
  if (m_num_components == 1)
    memset(m_mcu_lines[m_mcu_y_ofs] + m_image_bpl_xlt, pDst[m_image_bpl_xlt - 1], m_image_x_mcu - m_image_x);
  else
  {
    const uint8 y = pDst[m_image_bpl_xlt - 3 + 0], cb = pDst[m_image_bpl_xlt - 3 + 1], cr = pDst[m_image_bpl_xlt - 3 + 2];
    uint8 *q = m_mcu_lines[m_mcu_y_ofs] + m_image_bpl_xlt;
    for (int i = m_image_x; i < m_image_x_mcu; i++)
    {
      *q++ = y; *q++ = cb; *q++ = cr;
    }
  }

  if (++m_mcu_y_ofs == m_mcu_y)
  {
    process_mcu_row();
    m_mcu_y_ofs = 0;
  }
}